

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

int gmlc::utilities::numeric_conversion<int>(string_view V,int defValue)

{
  string_view V_00;
  bool bVar1;
  int in_EDX;
  invalid_argument *anon_var_0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  string_view in_stack_ffffffffffffffa8;
  int local_4;
  
  V_00._M_len._4_4_ = in_stack_ffffffffffffff9c;
  V_00._M_len._0_4_ = in_stack_ffffffffffffff98;
  V_00._M_str = in_stack_ffffffffffffffa0;
  bVar1 = nonNumericFirstCharacter(V_00);
  local_4 = in_EDX;
  if (!bVar1) {
    local_4 = numConv<int>(in_stack_ffffffffffffffa8);
  }
  return local_4;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}